

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof.c
# Opt level: O3

int Sat_ProofReduce(Vec_Set_t *vProof,void *pRoots,int hProofPivot)

{
  bool bVar1;
  word *pwVar2;
  uint uVar3;
  uint *__ptr;
  void *pvVar4;
  word **ppwVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  word *pwVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  word *pwVar15;
  word wVar16;
  int iVar17;
  int iVar18;
  timespec ts;
  ulong local_60;
  timespec local_40;
  
  clock_gettime(3,&local_40);
  uVar3 = Proof_MarkUsedRec(vProof,(Vec_Int_t *)pRoots);
  __ptr = (uint *)malloc(0x10);
  local_60 = 8;
  if (6 < uVar3 - 1) {
    local_60 = (ulong)uVar3;
  }
  __ptr[1] = 0;
  uVar3 = (uint)local_60;
  *__ptr = uVar3;
  if (uVar3 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar3 << 3);
  }
  *(void **)(__ptr + 2) = pvVar4;
  iVar17 = vProof->iPage;
  uVar7 = (ulong)iVar17;
  bVar6 = (byte)vProof->nPageSize;
  ppwVar5 = vProof->pPages;
  if ((iVar17 << (bVar6 & 0x1f)) + (int)*ppwVar5[uVar7] < 2) {
    __assert_fail("h <= Vec_SetHandCurrent(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                  ,0x117,"void Vec_SetShrinkS(Vec_Set_t *, int)");
  }
  uVar9 = 2L >> (bVar6 & 0x3f);
  vProof->iPageS = (int)uVar9;
  ppwVar5[uVar9][1] = (ulong)(vProof->uPageMask & 2);
  uVar9 = 0;
  if (-1 < iVar17) {
    lVar8 = 0;
    do {
      pwVar10 = ppwVar5[lVar8];
      if (2 < (int)*pwVar10) {
        uVar7 = 2;
        do {
          uVar3 = ((uint)pwVar10[uVar7] >> 3) + 3 >> 1;
          if (*(int *)((long)pwVar10 + uVar7 * 8 + 4) != 0) {
            bVar6 = (byte)vProof->nPageSize;
            iVar17 = 1 << (bVar6 & 0x1f);
            if (iVar17 <= (int)uVar3) {
              __assert_fail("nWords < (1 << p->nPageSize)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                            ,0xef,"int Vec_SetAppendS(Vec_Set_t *, int)");
            }
            iVar18 = vProof->iPageS;
            pwVar15 = ppwVar5[iVar18];
            wVar16 = pwVar15[1];
            iVar12 = iVar18;
            if (iVar17 <= (int)(uVar3 + (int)wVar16)) {
              iVar12 = iVar18 + 1;
              vProof->iPageS = iVar12;
              pwVar15 = ppwVar5[(long)iVar18 + 1];
              pwVar15[1] = 2;
              wVar16 = 2;
            }
            pwVar10 = pwVar10 + uVar7;
            pwVar15[1] = uVar3 + wVar16;
            uVar13 = ((iVar12 << (bVar6 & 0x1f)) - uVar3) + (int)(uVar3 + wVar16);
            *(uint *)((long)pwVar10 + 4) = uVar13;
            if ((int)uVar13 < 1) {
              __assert_fail("pNode->Id > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                            ,0x19b,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
            }
            iVar18 = (int)uVar9;
            iVar17 = (int)local_60;
            if (iVar18 == iVar17) {
              if (iVar17 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar4 = malloc(0x80);
                }
                else {
                  pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
                }
                *(void **)(__ptr + 2) = pvVar4;
                *__ptr = 0x10;
                local_60 = 0x10;
              }
              else {
                local_60 = (ulong)(uint)(iVar17 * 2);
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar4 = malloc(local_60 * 8);
                }
                else {
                  pvVar4 = realloc(*(void **)(__ptr + 2),local_60 * 8);
                }
                *(void **)(__ptr + 2) = pvVar4;
                *__ptr = iVar17 * 2;
              }
            }
            else {
              pvVar4 = *(void **)(__ptr + 2);
            }
            __ptr[1] = iVar18 + 1U;
            *(word **)((long)pvVar4 + (long)iVar18 * 8) = pwVar10;
            wVar16 = *pwVar10;
            if (7 < (uint)wVar16) {
              uVar9 = 0;
              do {
                uVar13 = *(uint *)((long)pwVar10 + uVar9 * 4 + 8);
                if ((uVar13 & 1) == 0) {
                  uVar14 = (int)uVar13 >> 2;
                  if ((int)uVar14 < 1) goto LAB_0093642b;
                  iVar17 = *(int *)((long)vProof->pPages[uVar14 >> ((byte)vProof->nPageSize & 0x1f)]
                                   + (ulong)(uVar14 & vProof->uPageMask) * 8 + 4);
                  if (iVar17 < 1) {
                    __assert_fail("pFanin->Id > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                                  ,0x1a1,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
                  }
                  *(uint *)((long)pwVar10 + uVar9 * 4 + 8) = (uVar13 & 2) + iVar17 * 4;
                }
                uVar9 = uVar9 + 1;
              } while (uVar9 < (uint)wVar16 >> 3);
            }
            uVar9 = (ulong)(iVar18 + 1U);
          }
          uVar3 = uVar3 + (int)uVar7;
          ppwVar5 = vProof->pPages;
          pwVar10 = ppwVar5[lVar8];
          uVar7 = (ulong)uVar3;
        } while ((int)uVar3 < (int)*pwVar10);
        uVar7 = (ulong)(uint)vProof->iPage;
      }
      bVar1 = lVar8 < (int)uVar7;
      lVar8 = lVar8 + 1;
    } while (bVar1);
  }
  if (1 < *(int *)((long)pRoots + 4)) {
    lVar8 = *(long *)((long)pRoots + 8);
    lVar11 = 1;
    do {
      uVar3 = *(uint *)(lVar8 + lVar11 * 4);
      if ((int)uVar3 < 1) {
LAB_0093642b:
        __assert_fail("h > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                      ,0x3a,"satset *Proof_NodeRead(Vec_Set_t *, int)");
      }
      if (ppwVar5[uVar3 >> ((byte)vProof->nPageSize & 0x1f)] == (word *)0x0) break;
      *(undefined4 *)(lVar8 + lVar11 * 4) =
           *(undefined4 *)
            ((long)ppwVar5[uVar3 >> ((byte)vProof->nPageSize & 0x1f)] +
            (ulong)(uVar3 & vProof->uPageMask) * 8 + 4);
      lVar11 = lVar11 + 1;
    } while (lVar11 < *(int *)((long)pRoots + 4));
  }
  if ((hProofPivot < 1) ||
     (bVar6 = (byte)vProof->nPageSize,
     (vProof->iPage << (bVar6 & 0x1f)) + (int)*ppwVar5[vProof->iPage] < hProofPivot)) {
    __assert_fail("hProofPivot >= 1 && hProofPivot <= Vec_SetHandCurrent(vProof)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                  ,0x1ab,"int Sat_ProofReduce(Vec_Set_t *, void *, int)");
  }
  uVar3 = (vProof->iPageS << (bVar6 & 0x1f)) + (int)ppwVar5[vProof->iPageS][1];
  pvVar4 = *(void **)(__ptr + 2);
  iVar17 = (int)uVar9;
  if (iVar17 < 1) {
    vProof->nEntries = iVar17;
    if (pvVar4 == (void *)0x0) goto LAB_009363b4;
  }
  else {
    pwVar10 = ppwVar5[(uint)hProofPivot >> (bVar6 & 0x1f)] + (hProofPivot & vProof->uPageMask);
    uVar7 = 0;
    do {
      pwVar15 = *(word **)((long)pvVar4 + uVar7 * 8);
      uVar13 = *(uint *)((long)pwVar15 + 4);
      *(uint *)((long)pwVar15 + 4) = 0;
      if ((uint)*pwVar15 < 8) {
        __assert_fail("nEnts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof.c"
                      ,0x3b,"int Proof_NodeWordNum(int)");
      }
      memmove(vProof->pPages[(int)uVar13 >> ((byte)vProof->nPageSize & 0x1f)] +
              (int)(vProof->uPageMask & uVar13),pwVar15,
              (ulong)(((uint)*pwVar15 >> 1) + 4 & 0xfffffff8) + 8);
      pwVar2 = (word *)0x0;
      if (pwVar15 < pwVar10) {
        uVar13 = uVar3;
        pwVar2 = pwVar10;
      }
      if (pwVar10 != (word *)0x0) {
        uVar3 = uVar13;
        pwVar10 = pwVar2;
      }
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
    vProof->nEntries = iVar17;
  }
  free(pvVar4);
LAB_009363b4:
  free(__ptr);
  ppwVar5 = vProof->pPages;
  bVar6 = (byte)vProof->nPageSize;
  uVar13 = (vProof->iPageS << (bVar6 & 0x1f)) + (int)ppwVar5[vProof->iPageS][1];
  if ((int)uVar13 <= (vProof->iPage << (bVar6 & 0x1f)) + (int)*ppwVar5[vProof->iPage]) {
    iVar17 = (int)uVar13 >> (bVar6 & 0x1f);
    vProof->iPage = iVar17;
    *ppwVar5[iVar17] = (long)(int)(uVar13 & vProof->uPageMask);
    if (-1 < iVar17) {
      uVar7 = 0;
      do {
        *ppwVar5[uVar7] = (long)(int)ppwVar5[uVar7][1];
        uVar7 = uVar7 + 1;
      } while (iVar17 + 1 != uVar7);
    }
    return uVar3;
  }
  __assert_fail("h <= Vec_SetHandCurrent(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecSet.h"
                ,0x111,"void Vec_SetShrink(Vec_Set_t *, int)");
}

Assistant:

int Sat_ProofReduce( Vec_Set_t * vProof, void * pRoots, int hProofPivot )
{
//    Vec_Set_t * vProof   = (Vec_Set_t *)&s->Proofs;
//    Vec_Int_t * vRoots   = (Vec_Int_t *)&s->claProofs;
    Vec_Int_t * vRoots   = (Vec_Int_t *)pRoots;
//    Vec_Int_t * vClauses = (Vec_Int_t *)&s->clauses;
    int fVerbose = 0;
    Vec_Ptr_t * vUsed;
    satset * pNode, * pFanin, * pPivot;
    int i, j, k, hTemp, nSize;
    abctime clk = Abc_Clock();
    static abctime TimeTotal = 0;
    int RetValue;
//Sat_ProofCheck0( vProof );

    // collect visited nodes
    nSize = Proof_MarkUsedRec( vProof, vRoots );
    vUsed = Vec_PtrAlloc( nSize );
//Sat_ProofCheck0( vProof );

    // relabel nodes to use smaller space
    Vec_SetShrinkS( vProof, 2 );
    Vec_SetForEachEntry( satset *, vProof, nSize, pNode, i, j )
    {
        nSize = Vec_SetWordNum( 2 + pNode->nEnts );
        if ( pNode->Id == 0 ) 
            continue;
        pNode->Id = Vec_SetAppendS( vProof, 2 + pNode->nEnts );
        assert( pNode->Id > 0 );
        Vec_PtrPush( vUsed, pNode );
        // update fanins
        Proof_NodeForeachFanin( vProof, pNode, pFanin, k )
            if ( (pNode->pEnts[k] & 1) == 0 ) // proof node
            {
                assert( pFanin->Id > 0 );
                pNode->pEnts[k] = (pFanin->Id << 2) | (pNode->pEnts[k] & 2);
            }
//            else // problem clause
//                assert( (int*)pFanin >= Vec_IntArray(vClauses) && (int*)pFanin < Vec_IntArray(vClauses)+Vec_IntSize(vClauses) );
    }
    // update roots
    Proof_ForeachNodeVec1( vRoots, vProof, pNode, i )
        Vec_IntWriteEntry( vRoots, i, pNode->Id );
    // determine new pivot
    assert( hProofPivot >= 1 && hProofPivot <= Vec_SetHandCurrent(vProof) );
    pPivot = Proof_NodeRead( vProof, hProofPivot );
    RetValue = Vec_SetHandCurrentS(vProof);
    // compact the nodes
    Vec_PtrForEachEntry( satset *, vUsed, pNode, i )
    {
        hTemp = pNode->Id; pNode->Id = 0;
        memmove( Vec_SetEntry(vProof, hTemp), pNode, sizeof(word)*Proof_NodeWordNum(pNode->nEnts) );
        if ( pPivot && pPivot <= pNode )
        {
            RetValue = hTemp;
            pPivot = NULL;
        }
    }
    Vec_SetWriteEntryNum( vProof, Vec_PtrSize(vUsed) );
    Vec_PtrFree( vUsed );

    // report the result
    if ( fVerbose )
    {
        printf( "\n" );
        printf( "The proof was reduced from %6.2f MB to %6.2f MB (by %6.2f %%)  ", 
            1.0 * Vec_SetMemory(vProof) / (1<<20), 1.0 * Vec_SetMemoryS(vProof) / (1<<20), 
            100.0 * (Vec_SetMemory(vProof) - Vec_SetMemoryS(vProof)) / Vec_SetMemory(vProof) );
        TimeTotal += Abc_Clock() - clk;
        Abc_PrintTime( 1, "Time", TimeTotal );
    }
    Vec_SetShrink( vProof, Vec_SetHandCurrentS(vProof) );
    Vec_SetShrinkLimits( vProof );
//    Sat_ProofReduceCheck( s );
//Sat_ProofCheck0( vProof );

    return RetValue;
}